

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVHandlePtr.cxx
# Opt level: O2

ssize_t __thiscall
cm::uv_async_ptr::send(uv_async_ptr *this,int __fd,void *__buf,size_t __n,int __flags)

{
  pthread_mutex_t *__mutex;
  uv_async_t *handle;
  int iVar1;
  uv_handle_deleter<uv_async_s> *puVar2;
  undefined4 extraout_var;
  
  puVar2 = std::get_deleter<cm::uv_handle_deleter<uv_async_s>,uv_async_s>
                     ((shared_ptr<uv_async_s> *)this);
  if (puVar2 != (uv_handle_deleter<uv_async_s> *)0x0) {
    __mutex = (pthread_mutex_t *)
              (puVar2->handleMutex).super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    std::mutex::lock((mutex *)&__mutex->__data);
    handle = (this->super_uv_handle_ptr_<uv_async_s>).super_uv_handle_ptr_base_<uv_async_s>.handle.
             super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (handle != (uv_async_t *)0x0) {
      uv_async_send(handle);
    }
    iVar1 = pthread_mutex_unlock(__mutex);
    return CONCAT44(extraout_var,iVar1);
  }
  __assert_fail("deleter",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmUVHandlePtr.cxx"
                ,0x75,"void cm::uv_async_ptr::send()");
}

Assistant:

void uv_async_ptr::send()
{
  auto deleter = std::get_deleter<uv_handle_deleter<uv_async_t>>(this->handle);
  assert(deleter);

  std::lock_guard<std::mutex> lock(*deleter->handleMutex);
  if (this->handle) {
    uv_async_send(*this);
  }
}